

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrROR0x7e(CPU *this)

{
  byte bVar1;
  Memory *this_00;
  byte bVar2;
  uint16_t uVar3;
  byte value;
  
  uVar3 = Memory::Read16(this->m,this->PC);
  this->PC = this->PC + 2;
  uVar3 = this->X + uVar3;
  this_00 = this->m;
  bVar2 = Memory::Read8(this_00,uVar3);
  bVar1 = this->field_0x2e;
  value = bVar1 & 0x80 | bVar2 >> 1;
  this->field_0x2e = bVar1 >> 7 | bVar2 << 7 | bVar1 & 0x3e | (value == 0) << 6;
  Memory::Write8(this_00,uVar3,value);
  return 7;
}

Assistant:

int CPU::instrROR0x7e() {
	uint16_t address = absolute_x_addr_j();
	m->Write8(address, ROR(m->Read8(address)));
	return 7;
}